

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O2

void __thiscall
QMenuBarPrivate::popupAction(QMenuBarPrivate *this,QAction *action,bool activateFirst)

{
  QWidget *this_00;
  long lVar1;
  char cVar2;
  bool bVar3;
  QMenu *pQVar4;
  QObject *ptr;
  QWidget *this_01;
  QPoint QVar5;
  QPoint QVar6;
  QScreen *p;
  undefined8 uVar7;
  QTLWExtra *pQVar8;
  Representation RVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  Representation RVar16;
  int iVar17;
  int iVar18;
  long in_FS_OFFSET;
  QRect QVar19;
  undefined1 auVar20 [16];
  int local_88;
  QPoint local_68;
  QPoint local_60;
  undefined1 local_58 [24];
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (action != (QAction *)0x0) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    pQVar4 = QAction::menu<QMenu*>(action);
    if ((pQVar4 != (QMenu *)0x0) && ((this->field_0x298 & 2) == 0)) {
      this->field_0x2a0 = this->field_0x2a0 | 1;
      cVar2 = QAction::isEnabled();
      if (cVar2 != '\0') {
        pQVar4 = QAction::menu<QMenu*>(action);
        if ((((pQVar4->super_QWidget).data)->widget_attributes & 1) == 0) {
          this->field_0x298 = this->field_0x298 & 0xfd;
          ptr = (QObject *)QAction::menu<QMenu*>(action);
          QWeakPointer<QObject>::assign<QObject>(&(this->activeMenu).wp,ptr);
          lVar1 = *(long *)((this->activeMenu).wp.value + 8);
          QWeakPointer<QObject>::assign<QObject>
                    ((QWeakPointer<QObject> *)(lVar1 + 0x2f8),&this_00->super_QObject);
          QWeakPointer<QObject>::assign<QObject>
                    ((QWeakPointer<QObject> *)(lVar1 + 0x308),(QObject *)action);
          QVar19 = actionRect(this,action);
          uVar11 = (QVar19._8_8_ & 0xffffffff00000000) + 0x100000000;
          local_40 = (QPoint)(QVar19._0_8_ & 0xffffffff | uVar11);
          this_01 = QWidget::window(this_00);
          QWidget::windowHandle(this_01);
          QVar5 = (QPoint)QWindow::screen();
          iVar12 = (QVar19.x2.m_i.m_i - QVar19.x1.m_i) + 1;
          local_58._0_8_ = (uint)(iVar12 / 2 + QVar19.x1.m_i.m_i) | uVar11;
          QVar6 = QWidget::mapToGlobal(this_00,(QPoint *)local_58);
          local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          p = (QScreen *)QScreen::virtualSiblingAt(QVar5);
          QPointer<QScreen>::QPointer<void>((QPointer<QScreen> *)local_58,p);
          bVar3 = QPointer::operator_cast_to_bool((QPointer *)local_58);
          if (!bVar3) {
            QWeakPointer<QObject>::assign<QObject>
                      ((QWeakPointer<QObject> *)local_58,(QObject *)QVar5);
          }
          std::swap<QPointer<QScreen>>
                    ((QPointer<QScreen> *)local_58,(QPointer<QScreen> *)(lVar1 + 0x410));
          uVar7 = (**(code **)(*(long *)(this->activeMenu).wp.value + 0x70))();
          std::swap<QPointer<QScreen>>
                    ((QPointer<QScreen> *)local_58,(QPointer<QScreen> *)(lVar1 + 0x410));
          QVar5 = QWidget::mapToGlobal(this_00,&local_40);
          local_60.yp.m_i = QVar6.yp.m_i.m_i;
          local_60.xp.m_i = QVar5.xp.m_i.m_i;
          auVar20 = QScreen::geometry();
          if (QVar5.xp.m_i.m_i <= auVar20._0_4_) {
            QVar5 = auVar20._0_8_;
          }
          iVar18 = auVar20._4_4_;
          if (QVar6.yp.m_i.m_i <= iVar18) {
            QVar6 = auVar20._0_8_;
          }
          local_60 = (QPoint)(((ulong)QVar6 & 0xffffffff00000000) + ((ulong)QVar5 & 0xffffffff));
          iVar13 = (int)((ulong)uVar7 >> 0x20);
          iVar17 = QVar6.yp.m_i.m_i - iVar13;
          iVar10 = QVar6.yp.m_i.m_i + iVar13;
          bVar3 = QWidget::isRightToLeft(this_00);
          RVar16 = QVar5.xp.m_i;
          if ((iVar17 < iVar18) && (auVar20._12_4_ < iVar10)) {
            iVar15 = (int)uVar7;
            RVar9.m_i = RVar16.m_i - iVar15;
            if ((bVar3 && RVar16.m_i < iVar15) ||
               (iVar14 = iVar15 + iVar12, local_88 = auVar20._8_4_, iVar15 = 0,
               iVar14 + RVar16.m_i <= local_88 && !bVar3)) {
              local_60.xp.m_i = iVar12 + RVar16.m_i + iVar15;
            }
            else if (!bVar3) {
              local_60.xp.m_i = RVar9.m_i;
            }
          }
          else if (bVar3) {
            local_60.xp.m_i = RVar16.m_i + iVar12;
          }
          if ((this->defaultPopDown == 0) || (iVar18 <= iVar17 && auVar20._12_4_ < iVar10)) {
            local_68.yp.m_i = QVar19.y1.m_i.m_i - iVar13;
            local_68.xp.m_i = 0;
            QVar6 = QWidget::mapToGlobal(this_00,&local_68);
            RVar16.m_i = QVar6.yp.m_i.m_i;
            if (QVar6.yp.m_i.m_i < iVar18) {
              RVar16.m_i = iVar18;
            }
            local_60.yp.m_i = RVar16.m_i;
          }
          pQVar8 = QWidgetPrivate::topData(*(QWidgetPrivate **)((this->activeMenu).wp.value + 8));
          QWeakPointer<QObject>::operator=
                    (&(pQVar8->initialScreen).wp,(QWeakPointer<QObject> *)local_58);
          QMenu::popup((QMenu *)(this->activeMenu).wp.value,&local_60,(QAction *)0x0);
          if (activateFirst) {
            QMenuPrivate::setFirstActionActive(*(QMenuPrivate **)((this->activeMenu).wp.value + 8));
          }
          QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)local_58);
        }
      }
      local_58._0_16_ = (undefined1  [16])actionRect(this,action);
      QWidget::update(this_00,(QRect *)local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuBarPrivate::popupAction(QAction *action, bool activateFirst)
{
    Q_Q(QMenuBar);
    if (!action || !action->menu() || closePopupMode)
        return;
    popupState = true;
    if (action->isEnabled() && action->menu()->isEnabled()) {
        closePopupMode = 0;
        activeMenu = action->menu();
        auto *activeMenuPriv = activeMenu->d_func();
        activeMenuPriv->causedPopup.widget = q;
        activeMenuPriv->causedPopup.action = action;

        QRect adjustedActionRect = actionRect(action);
        QPoint popupPos = adjustedActionRect.bottomLeft() + QPoint(0, 1);

        //we put the popup menu on the screen containing the bottom-center of the action rect
        QScreen *menubarScreen = q->window()->windowHandle()->screen();
        QPoint screenTestPos = q->mapToGlobal(popupPos + QPoint(adjustedActionRect.width() / 2, 0));
        QPointer<QScreen> popupScreen = menubarScreen->virtualSiblingAt(screenTestPos);
        if (!popupScreen)
            popupScreen = menubarScreen;
        std::swap(popupScreen, activeMenuPriv->popupScreen);
        const QSize popup_size = activeMenu->sizeHint();
        std::swap(popupScreen, activeMenuPriv->popupScreen);

        // Use screenTestPos.y() for the popup y position. This is the correct global y
        // consistent with the selected screen in cases where the action rect spans
        // multiple screens with different scale factors.
        QPoint pos(q->mapToGlobal(popupPos).x(), screenTestPos.y());

        QRect screenRect = popupScreen->geometry();
        pos = QPoint(qMax(pos.x(), screenRect.x()), qMax(pos.y(), screenRect.y()));
        const bool fitUp = (pos.y() - popup_size.height() >= screenRect.top());
        const bool fitDown = (pos.y() + popup_size.height() <= screenRect.bottom());
        const bool rtl = q->isRightToLeft();
        const int actionWidth = adjustedActionRect.width();

        if (!fitUp && !fitDown) { //we should shift the menu
            bool shouldShiftToRight = !rtl;
            if (rtl && popup_size.width() > pos.x())
                shouldShiftToRight = true;
            else if (actionWidth + popup_size.width() + pos.x() > screenRect.right())
                shouldShiftToRight = false;

            if (shouldShiftToRight) {
                pos.rx() += actionWidth + (rtl ? popup_size.width() : 0);
            } else {
                //shift to left
                if (!rtl)
                    pos.rx() -= popup_size.width();
            }
        } else if (rtl) {
            pos.rx() += actionWidth;
        }

        if (!defaultPopDown || (fitUp && !fitDown))
            pos.setY(qMax(screenRect.y(), q->mapToGlobal(QPoint(0, adjustedActionRect.top()-popup_size.height())).y()));
        QMenuPrivate::get(activeMenu)->topData()->initialScreen = popupScreen;
        activeMenu->popup(pos);
        if (activateFirst)
            activeMenu->d_func()->setFirstActionActive();
    }
    q->update(actionRect(action));
}